

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_decoder_model_info(AV1Context *ctx,BitReadCtx_t *gb,AV1RawDecoderModelInfo *current)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  undefined8 in_RAX;
  RK_U32 value;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  RVar1 = mpp_av1_read_unsigned
                    (&ctx->gb,5,"buffer_delay_length_minus_1",(RK_U32 *)((long)&uStack_28 + 4),0,
                     0x1f);
  if (-1 < RVar1) {
    *(undefined1 *)&gb->data_ = uStack_28._4_1_;
    RVar1 = -1;
    RVar2 = mpp_av1_read_unsigned
                      (&ctx->gb,0x20,"num_units_in_decoding_tick",(RK_U32 *)((long)&uStack_28 + 4),0
                       ,0xffffffff);
    if (-1 < RVar2) {
      *(undefined4 *)((long)&gb->data_ + 4) = uStack_28._4_4_;
      RVar1 = mpp_av1_read_unsigned
                        (&ctx->gb,5,"buffer_removal_time_length_minus_1",
                         (RK_U32 *)((long)&uStack_28 + 4),0,0x1f);
      if (RVar1 < 0) {
        RVar1 = -1;
      }
      else {
        *(undefined1 *)&gb->bytes_left_ = uStack_28._4_1_;
        RVar1 = 0;
        RVar2 = mpp_av1_read_unsigned
                          (&ctx->gb,5,"frame_presentation_time_length_minus_1",
                           (RK_U32 *)((long)&uStack_28 + 4),0,0x1f);
        if (RVar2 < 0) {
          RVar1 = -1;
        }
        else {
          *(undefined1 *)((long)&gb->bytes_left_ + 1) = uStack_28._4_1_;
        }
      }
    }
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_decoder_model_info(AV1Context *ctx, BitReadCtx_t *gb,
                                         AV1RawDecoderModelInfo *current)
{
    RK_S32 err;
    (void)ctx;
    fb(5, buffer_delay_length_minus_1);
    fb(32, num_units_in_decoding_tick);
    fb(5,  buffer_removal_time_length_minus_1);
    fb(5,  frame_presentation_time_length_minus_1);

    return 0;
}